

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drink_factory.hpp
# Opt level: O3

void __thiscall DrinkFactory::DrinkFactory(DrinkFactory *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  AbstractHotDrinkFactory *pAVar2;
  AbstractHotDrinkFactory *pAVar3;
  mapped_type *pmVar4;
  key_type local_40;
  
  (this->factories)._M_h._M_buckets = &(this->factories)._M_h._M_single_bucket;
  (this->factories)._M_h._M_bucket_count = 1;
  (this->factories)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->factories)._M_h._M_element_count = 0;
  (this->factories)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->factories)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->factories)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pAVar3 = (AbstractHotDrinkFactory *)operator_new(8);
  pAVar3->_vptr_AbstractHotDrinkFactory = (_func_int **)&PTR_make_00106cc8;
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"coffee","");
  pmVar4 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this,&local_40);
  pAVar2 = (pmVar4->_M_t).
           super___uniq_ptr_impl<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>
           ._M_t.
           super__Tuple_impl<0UL,_AbstractHotDrinkFactory_*,_std::default_delete<AbstractHotDrinkFactory>_>
           .super__Head_base<0UL,_AbstractHotDrinkFactory_*,_false>._M_head_impl;
  (pmVar4->_M_t).
  super___uniq_ptr_impl<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>._M_t
  .super__Tuple_impl<0UL,_AbstractHotDrinkFactory_*,_std::default_delete<AbstractHotDrinkFactory>_>.
  super__Head_base<0UL,_AbstractHotDrinkFactory_*,_false>._M_head_impl = pAVar3;
  if (pAVar2 != (AbstractHotDrinkFactory *)0x0) {
    operator_delete(pAVar2,8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (AbstractHotDrinkFactory *)operator_new(8);
  pAVar3->_vptr_AbstractHotDrinkFactory = (_func_int **)&PTR_make_00106d48;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"tea","");
  pmVar4 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this,&local_40);
  pAVar2 = (pmVar4->_M_t).
           super___uniq_ptr_impl<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>
           ._M_t.
           super__Tuple_impl<0UL,_AbstractHotDrinkFactory_*,_std::default_delete<AbstractHotDrinkFactory>_>
           .super__Head_base<0UL,_AbstractHotDrinkFactory_*,_false>._M_head_impl;
  (pmVar4->_M_t).
  super___uniq_ptr_impl<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>._M_t
  .super__Tuple_impl<0UL,_AbstractHotDrinkFactory_*,_std::default_delete<AbstractHotDrinkFactory>_>.
  super__Head_base<0UL,_AbstractHotDrinkFactory_*,_false>._M_head_impl = pAVar3;
  if (pAVar2 != (AbstractHotDrinkFactory *)0x0) {
    operator_delete(pAVar2,8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

DrinkFactory()
	{
		factories["coffee"] = std::make_unique<CoffeeFactory>();
		factories["tea"] = std::make_unique<TeaFactory>();
	}